

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

UBool __thiscall icu_63::ResourceDataValue::isNoInheritanceMarker(ResourceDataValue *this)

{
  uint uVar1;
  int iVar2;
  ResourceData *pRVar3;
  int32_t *piVar4;
  ulong uVar5;
  uint16_t **ppuVar6;
  uint16_t *puVar7;
  uint16_t uVar8;
  uint uVar9;
  
  uVar1 = this->res;
  uVar5 = (ulong)uVar1;
  uVar9 = uVar1 & 0xfffffff;
  if (uVar9 == 0) {
    return '\0';
  }
  pRVar3 = this->pResData;
  if (uVar1 < 0x10000000) {
    piVar4 = pRVar3->pRoot;
    if (piVar4[uVar5] != 3) {
      return '\0';
    }
    if ((short)piVar4[uVar5 + 1] != 0x2205) {
      return '\0';
    }
    if (*(short *)((long)piVar4 + uVar5 * 4 + 6) != 0x2205) {
      return '\0';
    }
    puVar7 = (uint16_t *)(piVar4 + uVar5 + 2);
  }
  else {
    if ((uVar1 & 0xf0000000) != 0x60000000) {
      return '\0';
    }
    iVar2 = pRVar3->poolStringIndexLimit;
    uVar1 = uVar9 - iVar2;
    if ((int)uVar9 < iVar2) {
      uVar1 = uVar9;
    }
    ppuVar6 = &pRVar3->p16BitUnits;
    if ((int)uVar9 < iVar2) {
      ppuVar6 = &pRVar3->poolBundleStrings;
    }
    puVar7 = *ppuVar6 + uVar1;
    if (*puVar7 != 0xdc03) {
      if (*puVar7 != 0x2205) {
        return '\0';
      }
      if (puVar7[1] != 0x2205) {
        return '\0';
      }
      if (puVar7[2] != 0x2205) {
        return '\0';
      }
      puVar7 = puVar7 + 3;
      uVar8 = 0;
      goto LAB_001b15a4;
    }
    if (puVar7[1] != 0x2205) {
      return '\0';
    }
    if (puVar7[2] != 0x2205) {
      return '\0';
    }
    puVar7 = puVar7 + 3;
  }
  uVar8 = 0x2205;
LAB_001b15a4:
  return *puVar7 == uVar8;
}

Assistant:

UBool ResourceDataValue::isNoInheritanceMarker() const {
    return ::isNoInheritanceMarker(pResData, res);
}